

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::modbaseappr(BN *this,bt *diviser)

{
  ushort uVar1;
  uint uVar2;
  divide_by_zero *this_00;
  size_type sVar3;
  reference pvVar4;
  ulong local_30;
  size_t i;
  bt2 curr;
  bt *diviser_local;
  BN *this_local;
  
  if (*diviser == 0) {
    this_00 = (divide_by_zero *)__cxa_allocate_exception(0x10);
    divide_by_zero::divide_by_zero(this_00);
    __cxa_throw(this_00,&divide_by_zero::typeinfo,divide_by_zero::~divide_by_zero);
  }
  i._0_4_ = 0;
  local_30 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
  while( true ) {
    local_30 = local_30 - 1;
    sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
    if (sVar3 <= local_30) break;
    pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->ba,local_30);
    uVar2 = (uint)*pvVar4 + (uint)i * 0x10000;
    uVar1 = *diviser;
    pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->ba,local_30);
    *pvVar4 = (value_type)(uVar2 / uVar1);
    i._0_4_ = uVar2 % (uint)*diviser;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,1);
  pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](&this->ba,0);
  *pvVar4 = (value_type)(uint)i;
  return this;
}

Assistant:

BN& BN::modbaseappr(const bt &diviser)
{
    if(diviser == 0)
        throw divide_by_zero();
    bt2 curr = 0;
    for(size_t i = ba.size() - 1; i < ba.size(); --i) {
        curr <<= bz8;
        curr += ba[i];
        ba[i] = curr / diviser;
        curr %= diviser;
    }
    ba.resize(1);
    ba[0] = curr;
    return *this;
}